

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O0

bool crnlib::string_to_uint(char **pBuf,uint *value)

{
  int iVar1;
  uint *in_RSI;
  undefined8 *in_RDI;
  bool bVar2;
  uint c;
  uint result2;
  uint result8;
  uint result;
  char *p;
  uint local_24;
  char *local_20;
  
  *in_RSI = 0;
  local_20 = (char *)*in_RDI;
  while( true ) {
    bVar2 = false;
    if (*local_20 != '\0') {
      iVar1 = isspace((int)*local_20);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    local_20 = local_20 + 1;
  }
  local_24 = 0;
  iVar1 = isdigit((int)*local_20);
  if (iVar1 != 0) {
    while( true ) {
      bVar2 = false;
      if (*local_20 != '\0') {
        iVar1 = isdigit((int)*local_20);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) {
        *in_RSI = local_24;
        *in_RDI = local_20;
        return true;
      }
      if ((local_24 & 0xe0000000) != 0) {
        return false;
      }
      if (local_24 * -8 - 1 < local_24 * 2) {
        return false;
      }
      if (local_24 * -10 - 1 < (int)*local_20 - 0x30U) break;
      local_24 = ((int)*local_20 - 0x30U) + local_24 * 10;
      local_20 = local_20 + 1;
    }
  }
  return false;
}

Assistant:

bool string_to_uint(const char*& pBuf, uint& value) {
  value = 0;

  CRNLIB_ASSERT(pBuf);
  const char* p = pBuf;

  while (*p && isspace(*p))
    p++;

  uint result = 0;

  if (!isdigit(*p))
    return false;

  while (*p && isdigit(*p)) {
    if (result & 0xE0000000U)
      return false;

    const uint result8 = result << 3U;
    const uint result2 = result << 1U;

    if (result2 > (0xFFFFFFFFU - result8))
      return false;

    result = result8 + result2;

    uint c = p[0] - '0';
    if (c > (0xFFFFFFFFU - result))
      return false;

    result += c;

    p++;
  }

  value = result;

  pBuf = p;

  return true;
}